

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_values.cpp
# Opt level: O0

StringFormat ON_AngleValue::AngleStringFormatFromUnsigned(uint string_format_as_unsigned)

{
  StringFormat local_9;
  uint string_format_as_unsigned_local;
  
  switch(string_format_as_unsigned) {
  case 0:
    local_9 = ExactDecimal;
    break;
  case 1:
    local_9 = ExactFraction;
    break;
  case 2:
    local_9 = CleanDecimal;
    break;
  case 3:
    local_9 = CleanFraction;
    break;
  default:
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_string_values.cpp"
               ,0x38,"","Invalid string_format_as_unsigned value.");
    local_9 = Unset.m_string_format;
  }
  return local_9;
}

Assistant:

ON_AngleValue::StringFormat ON_AngleValue::AngleStringFormatFromUnsigned(
  unsigned int string_format_as_unsigned
)
{
  switch (string_format_as_unsigned)
  {
    ON_ENUM_FROM_UNSIGNED_CASE(ON_AngleValue::StringFormat::ExactDecimal);
    ON_ENUM_FROM_UNSIGNED_CASE(ON_AngleValue::StringFormat::ExactFraction);
    ON_ENUM_FROM_UNSIGNED_CASE(ON_AngleValue::StringFormat::CleanDecimal);
    ON_ENUM_FROM_UNSIGNED_CASE(ON_AngleValue::StringFormat::CleanFraction);
  }
  ON_ERROR("Invalid string_format_as_unsigned value.");
  return (ON_AngleValue::Unset.m_string_format);
}